

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

size_t anon_unknown.dwarf_59d73b::countMaxConsecutiveEqualSigns(string *name)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  unsigned_long *puVar2;
  char local_99;
  char *local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  unsigned_long local_70 [2];
  undefined8 local_60;
  char *local_58;
  char *local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  endIt;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  startIt;
  size_t max;
  string *name_local;
  
  startIt._M_current = (char *)0x0;
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  endIt._M_current._7_1_ = 0x3d;
  local_40 = (char *)std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                               (__first,__last,(char *)((long)&endIt._M_current + 7));
  local_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_40;
  while( true ) {
    local_48._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_48);
    if (!bVar1) break;
    local_58 = (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_20,1);
    local_60 = std::__cxx11::string::end();
    local_80 = (char *)std::
                       find_if_not<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,(anonymous_namespace)::countMaxConsecutiveEqualSigns(std::__cxx11::string_const&)::__0>
                                 (local_58,local_60);
    local_78 = local_20._M_current;
    local_50 = local_80;
    local_40 = local_80;
    local_70[0] = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (local_20,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_80);
    puVar2 = std::max<unsigned_long>((unsigned_long *)&startIt,local_70);
    startIt._M_current = (char *)*puVar2;
    local_90._M_current = local_40;
    local_98 = (char *)std::__cxx11::string::end();
    local_99 = '=';
    local_88 = (char *)std::
                       find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                                 (local_90,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )local_98,&local_99);
    local_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_88;
  }
  return (size_t)startIt._M_current;
}

Assistant:

std::size_t countMaxConsecutiveEqualSigns(const std::string& name)
{
  std::size_t max = 0;
  auto startIt = find(name.begin(), name.end(), '=');
  auto endIt = startIt;
  for (; startIt != name.end(); startIt = find(endIt, name.end(), '=')) {
    endIt =
      find_if_not(startIt + 1, name.end(), [](char c) { return c == '='; });
    max =
      std::max(max, static_cast<std::size_t>(std::distance(startIt, endIt)));
  }
  return max;
}